

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *ci,_Bool newsession)

{
  undefined1 *puVar1;
  byte bVar2;
  curl_trc_feat *pcVar3;
  byte bVar4;
  int iVar5;
  FILE *input;
  long lVar6;
  char *lineptr;
  FILE *local_58;
  dynbuf buf;
  
  if (ci == (CookieInfo *)0x0) {
    ci = (CookieInfo *)(*Curl_ccalloc)(1,0x7f8);
    if (ci == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
    lVar6 = 0;
    do {
      Curl_llist_init((Curl_llist *)((long)&ci->cookielist[0]._head + lVar6),(Curl_llist_dtor)0x0);
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x7e0);
    ci->next_expiration = 0x7fffffffffffffff;
  }
  bVar2 = ci->field_0x7f0;
  bVar4 = bVar2 & 0xfd | newsession * '\x02';
  ci->field_0x7f0 = bVar4;
  input = _stdin;
  if (data == (Curl_easy *)0x0) goto LAB_0011dc24;
  if ((file == (char *)0x0) || (*file == '\0')) {
LAB_0011dc0f:
    ci->field_0x7f0 = ci->field_0x7f0 & 0xfe;
  }
  else {
    if ((*file == '-') && (file[1] == '\0')) {
      ci->field_0x7f0 = bVar2 & 0xfc | newsession * '\x02';
      if (input == (FILE *)0x0) goto LAB_0011dc16;
      local_58 = (FILE *)0x0;
    }
    else {
      input = fopen64(file,"rb");
      if (input == (FILE *)0x0) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"WARNING: failed to open cookie file \"%s\"",file);
        }
        goto LAB_0011dc0f;
      }
      ci->field_0x7f0 = ci->field_0x7f0 & 0xfe;
      local_58 = input;
    }
    Curl_dyn_init(&buf,5000);
    iVar5 = Curl_get_line(&buf,(FILE *)input);
    if (iVar5 != 0) {
      do {
        lineptr = Curl_dyn_ptr(&buf);
        iVar5 = curl_strnequal(lineptr,"Set-Cookie:",0xb);
        if (iVar5 != 0) {
          lineptr = lineptr + 0xb;
          Curl_str_passblanks(&lineptr);
        }
        Curl_cookie_add(data,ci,iVar5 != 0,true,lineptr,(char *)0x0,(char *)0x0,true);
        iVar5 = Curl_get_line(&buf,(FILE *)input);
      } while (iVar5 != 0);
    }
    Curl_dyn_free(&buf);
    remove_expired(ci);
    if (local_58 != (FILE *)0x0) {
      fclose(local_58);
    }
  }
LAB_0011dc16:
  puVar1 = &(data->state).field_0x7bf;
  *puVar1 = *puVar1 | 0x20;
  bVar4 = ci->field_0x7f0;
LAB_0011dc24:
  ci->field_0x7f0 = bVar4 | 1;
  return ci;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *ci,
                                    bool newsession)
{
  FILE *handle = NULL;

  if(!ci) {
    int i;

    /* we did not get a struct, create one */
    ci = calloc(1, sizeof(struct CookieInfo));
    if(!ci)
      return NULL; /* failed to get memory */

    /* This does not use the destructor callback since we want to add
       and remove to lists while keeping the cookie struct intact */
    for(i = 0; i < COOKIE_HASH_SIZE; i++)
      Curl_llist_init(&ci->cookielist[i], NULL);
    /*
     * Initialize the next_expiration time to signal that we do not have enough
     * information yet.
     */
    ci->next_expiration = CURL_OFF_T_MAX;
  }
  ci->newsession = newsession; /* new session? */

  if(data) {
    FILE *fp = NULL;
    if(file && *file) {
      if(!strcmp(file, "-"))
        fp = stdin;
      else {
        fp = fopen(file, "rb");
        if(!fp)
          infof(data, "WARNING: failed to open cookie file \"%s\"", file);
        else
          handle = fp;
      }
    }

    ci->running = FALSE; /* this is not running, this is init */
    if(fp) {
      struct dynbuf buf;
      Curl_dyn_init(&buf, MAX_COOKIE_LINE);
      while(Curl_get_line(&buf, fp)) {
        const char *lineptr = Curl_dyn_ptr(&buf);
        bool headerline = FALSE;
        if(checkprefix("Set-Cookie:", lineptr)) {
          /* This is a cookie line, get it! */
          lineptr += 11;
          headerline = TRUE;
          Curl_str_passblanks(&lineptr);
        }

        Curl_cookie_add(data, ci, headerline, TRUE, lineptr, NULL, NULL, TRUE);
      }
      Curl_dyn_free(&buf); /* free the line buffer */

      /*
       * Remove expired cookies from the hash. We must make sure to run this
       * after reading the file, and not on every cookie.
       */
      remove_expired(ci);

      if(handle)
        fclose(handle);
    }
    data->state.cookie_engine = TRUE;
  }
  ci->running = TRUE;          /* now, we are running */

  return ci;
}